

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

vw * VW::seed_vw_model(vw *vw_model,string *extra_args,trace_message_t trace_listener,
                      void *trace_context)

{
  size_type sVar1;
  int iVar2;
  long *plVar3;
  vw *pvVar4;
  long *plVar5;
  shared_ptr<VW::config::base_option> *option;
  _Alloc_hider _Var6;
  string serialized_options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  options_serializer_boost_po serializer;
  string local_260;
  undefined **local_240;
  trace_message_t local_238;
  void *local_230;
  string *local_228;
  undefined1 *local_220 [2];
  undefined1 local_210 [16];
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  string local_1e0;
  undefined **local_1c0;
  long local_1b8;
  undefined8 auStack_1b0 [15];
  ios_base local_138 [264];
  
  local_240 = &PTR_add_002e0978;
  local_1c0 = &PTR_add_002e0978;
  local_238 = trace_listener;
  local_230 = trace_context;
  local_228 = extra_args;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  *(undefined8 *)((long)auStack_1b0 + *(long *)(local_1b8 + -0x18)) = 0xf;
  (*vw_model->options->_vptr_options_i[3])(&local_260);
  sVar1 = local_260._M_string_length;
  if (local_260._M_dataplus._M_p != (pointer)local_260._M_string_length) {
    _Var6._M_p = local_260._M_dataplus._M_p;
    do {
      iVar2 = (*vw_model->options->_vptr_options_i[1])(vw_model->options,*(long *)_Var6._M_p + 8);
      if ((char)iVar2 != '\0') {
        iVar2 = std::__cxx11::string::compare((char *)(*(long *)_Var6._M_p + 8));
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)(*(long *)_Var6._M_p + 8));
          if (iVar2 != 0) {
            config::options_serializer_boost_po::add
                      ((options_serializer_boost_po *)&local_1c0,*(base_option **)_Var6._M_p);
          }
        }
      }
      _Var6._M_p = _Var6._M_p + 0x10;
    } while (_Var6._M_p != (pointer)sVar1);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
             *)&local_260);
  config::options_serializer_boost_po::str_abi_cxx11_
            (&local_260,(options_serializer_boost_po *)&local_1c0);
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_220,local_260._M_dataplus._M_p,
             local_260._M_dataplus._M_p + local_260._M_string_length);
  std::__cxx11::string::append((char *)local_220);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_220,(ulong)(local_228->_M_dataplus)._M_p);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_1f0 = *plVar5;
    lStack_1e8 = plVar3[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *plVar5;
    local_200 = (long *)*plVar3;
  }
  local_1f8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_260,(string *)&local_200);
  if (local_200 != &local_1f0) {
    operator_delete(local_200);
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0]);
  }
  std::__cxx11::string::string
            ((string *)&local_1e0,local_260._M_dataplus._M_p,(allocator *)&local_200);
  pvVar4 = initialize(&local_1e0,(io_buf *)0x0,true,local_238,local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if (pvVar4->sd != (shared_data *)0x0) {
    free(pvVar4->sd);
  }
  if ((pvVar4->weights).sparse == true) {
    sparse_parameters::shallow_copy
              (&(pvVar4->weights).sparse_weights,&(vw_model->weights).sparse_weights);
  }
  else {
    if ((pvVar4->weights).dense_weights._seeded == false) {
      free((pvVar4->weights).dense_weights._begin);
    }
    (pvVar4->weights).dense_weights._begin = (vw_model->weights).dense_weights._begin;
    (pvVar4->weights).dense_weights._weight_mask = (vw_model->weights).dense_weights._weight_mask;
    (pvVar4->weights).dense_weights._stride_shift = (vw_model->weights).dense_weights._stride_shift;
    (pvVar4->weights).dense_weights._seeded = true;
  }
  pvVar4->sd = vw_model->sd;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  local_1c0 = local_240;
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  return pvVar4;
}

Assistant:

vw* seed_vw_model(vw* vw_model, const string extra_args, trace_message_t trace_listener, void* trace_context)
{
  options_serializer_boost_po serializer;
  for (auto const& option : vw_model->options->get_all_options())
  {
    if (vw_model->options->was_supplied(option->m_name))
    {
      // ignore no_stdin since it will be added by vw::initialize, and ignore -i since we don't want to reload the
      // model.
      if (option->m_name == "no_stdin" || option->m_name == "initial_regressor")
      {
        continue;
      }

      serializer.add(*option);
    }
  }

  auto serialized_options = serializer.str();
  serialized_options = serialized_options + " " + extra_args;

  vw* new_model =
      VW::initialize(serialized_options.c_str(), nullptr, true /* skipModelLoad */, trace_listener, trace_context);
  free_it(new_model->sd);

  // reference model states stored in the specified VW instance
  new_model->weights.shallow_copy(vw_model->weights);  // regressor
  new_model->sd = vw_model->sd;                        // shared data

  return new_model;
}